

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsEncoder.cpp
# Opt level: O3

void __thiscall
Js::AsmJsEncoder::ReadOpTemplate<(Js::LayoutSize)2>(AsmJsEncoder *this,OpCodeAsmJs op)

{
  code *pcVar1;
  bool bVar2;
  OpLayoutBrInt2_Large *playout;
  OpLayoutAsmCall_Large *pOVar3;
  OpLayoutBrInt1_Large *playout_00;
  OpLayoutBrInt1Const1_Large *playout_01;
  char16 *pcVar4;
  undefined4 *puVar5;
  undefined6 in_register_00000032;
  AsmJsRetType local_14;
  
  switch((int)CONCAT62(in_register_00000032,op)) {
  case 9:
    ByteCodeReader::Int1Const1_Large(&this->mReader,&this->ip);
    break;
  case 10:
  case 0x29:
  case 0x47:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 0xb7:
  case 0xbb:
    ByteCodeReader::Int2_Large(&this->mReader,&this->ip);
    break;
  default:
    pcVar4 = OpCodeUtilAsmJs::GetOpCodeName(op);
    Output::Print(L"Dispatch to bad opcode : %s\n",pcVar4);
    Output::Flush();
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsEncoder.cpp"
                                ,0x6a,"(false)","false");
    if (bVar2) {
      *puVar5 = 0;
      return;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case 0xe:
  case 0x46:
  case 0x90:
  case 0xc5:
  case 199:
  case 0xcc:
  case 0xcd:
  case 0xd3:
    ByteCodeReader::Float2_Large(&this->mReader,&this->ip);
    break;
  case 0x10:
  case 0x45:
  case 0x8a:
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xc0:
  case 0xc1:
  case 0xc2:
  case 0xc3:
  case 0xc4:
  case 0xc6:
  case 200:
  case 0xc9:
  case 0xcb:
    ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    break;
  case 0x12:
    ByteCodeReader::AsmCall_Large(&this->mReader,&this->ip);
    break;
  case 0x14:
  case 0x20:
    ByteCodeReader::Reg1Int1_Large(&this->mReader,&this->ip);
    break;
  case 0x17:
  case 0x1f:
    ByteCodeReader::Reg1Double1_Large(&this->mReader,&this->ip);
    break;
  case 0x18:
    ByteCodeReader::Int1Reg1_Large(&this->mReader,&this->ip);
    break;
  case 0x19:
    ByteCodeReader::Float1Reg1_Large(&this->mReader,&this->ip);
    break;
  case 0x1a:
    ByteCodeReader::Double1Reg1_Large(&this->mReader,&this->ip);
    break;
  case 0x1d:
    pOVar3 = ByteCodeReader::AsmCall_Large(&this->mReader,&this->ip);
    AsmJsRetType::AsmJsRetType(&local_14,(int)pOVar3->ReturnType);
    break;
  case 0x22:
    ByteCodeReader::Reg1Float1_Large(&this->mReader,&this->ip);
    break;
  case 0x23:
    ByteCodeReader::AsmUnsigned1_Large(&this->mReader,&this->ip);
    break;
  case 0x26:
    playout_00 = ByteCodeReader::BrInt1_Large(&this->mReader,&this->ip);
    OP_BrTrue<Js::OpLayoutT_BrInt1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_00);
    return;
  case 0x28:
  case 0x2b:
    playout = ByteCodeReader::BrInt2_Large(&this->mReader,&this->ip);
    OP_BrEq<Js::OpLayoutT_BrInt2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>(this,playout);
    return;
  case 0x2c:
    playout_01 = ByteCodeReader::BrInt1Const1_Large(&this->mReader,&this->ip);
    OP_BrEqConst<Js::OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_01);
    return;
  case 0x32:
    ByteCodeReader::Int1Double1_Large(&this->mReader,&this->ip);
    break;
  case 0x33:
    ByteCodeReader::Int1Float1_Large(&this->mReader,&this->ip);
    break;
  case 0x3c:
  case 0x3f:
    ByteCodeReader::Double1Int1_Large(&this->mReader,&this->ip);
    break;
  case 0x3e:
    ByteCodeReader::Double1Float1_Large(&this->mReader,&this->ip);
    break;
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x56:
  case 0x57:
  case 0xed:
  case 0xee:
  case 0x141:
  case 0x142:
    ByteCodeReader::ElementSlot_Large(&this->mReader,&this->ip);
    break;
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
    ByteCodeReader::AsmTypedArr_Large(&this->mReader,&this->ip);
    break;
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x74:
  case 0x76:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
  case 0xb8:
  case 0xb9:
  case 0xba:
    ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    break;
  case 0x8b:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0xca:
  case 0xce:
  case 0xcf:
  case 0xd1:
    ByteCodeReader::Double3_Large(&this->mReader,&this->ip);
    break;
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
    ByteCodeReader::Float3_Large(&this->mReader,&this->ip);
    break;
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
  case 0xb0:
    ByteCodeReader::Int1Double2_Large(&this->mReader,&this->ip);
    break;
  case 0xb1:
  case 0xb2:
  case 0xb3:
  case 0xb4:
  case 0xb5:
  case 0xb6:
    ByteCodeReader::Int1Float2_Large(&this->mReader,&this->ip);
    break;
  case 0xd4:
    ByteCodeReader::Float1Double1_Large(&this->mReader,&this->ip);
    break;
  case 0xd5:
    ByteCodeReader::Float1Int1_Large(&this->mReader,&this->ip);
    break;
  case 0xd8:
    ByteCodeReader::Int32x4_1Int4_Large(&this->mReader,&this->ip);
    break;
  case 0xd9:
    ByteCodeReader::Int32x4_1Int1_Large(&this->mReader,&this->ip);
    break;
  case 0xda:
  case 0xdb:
    ByteCodeReader::Int32x4_1Float32x4_1_Large(&this->mReader,&this->ip);
    break;
  case 0xdc:
  case 0xe7:
  case 0xec:
  case 0xef:
    ByteCodeReader::Int32x4_2_Large(&this->mReader,&this->ip);
    break;
  case 0xdd:
  case 0xde:
  case 0xdf:
  case 0xe4:
  case 0xe5:
  case 0xe6:
    ByteCodeReader::Int32x4_3_Large(&this->mReader,&this->ip);
    break;
  case 0xe0:
  case 0xe1:
  case 0xe2:
    ByteCodeReader::Bool32x4_1Int32x4_2_Large(&this->mReader,&this->ip);
    break;
  case 0xe3:
    ByteCodeReader::Int32x4_1Bool32x4_1Int32x4_2_Large(&this->mReader,&this->ip);
    break;
  case 0xf0:
    ByteCodeReader::Reg1Int32x4_1_Large(&this->mReader,&this->ip);
    break;
  case 0x127:
    ByteCodeReader::Float32x4_1Float4_Large(&this->mReader,&this->ip);
    break;
  case 0x128:
    ByteCodeReader::Float32x4_1Float1_Large(&this->mReader,&this->ip);
    break;
  case 0x129:
  case 0x12a:
    ByteCodeReader::Float32x4_1Int32x4_1_Large(&this->mReader,&this->ip);
    break;
  case 299:
  case 300:
  case 0x134:
  case 0x135:
  case 0x136:
  case 0x140:
  case 0x143:
    ByteCodeReader::Float32x4_2_Large(&this->mReader,&this->ip);
    break;
  case 0x12d:
  case 0x12e:
  case 0x12f:
  case 0x130:
  case 0x132:
  case 0x133:
    ByteCodeReader::Float32x4_3_Large(&this->mReader,&this->ip);
    break;
  case 0x139:
  case 0x13a:
  case 0x13b:
  case 0x13c:
  case 0x13d:
  case 0x13e:
    ByteCodeReader::Bool32x4_1Float32x4_2_Large(&this->mReader,&this->ip);
    break;
  case 0x13f:
    ByteCodeReader::Float32x4_1Bool32x4_1Float32x4_2_Large(&this->mReader,&this->ip);
    break;
  case 0x145:
    ByteCodeReader::Reg1Float32x4_1_Large(&this->mReader,&this->ip);
    break;
  case 0x1a9:
    ByteCodeReader::Int1Int32x4_1Int1_Large(&this->mReader,&this->ip);
    break;
  case 0x1aa:
    ByteCodeReader::Int32x4_2Int2_Large(&this->mReader,&this->ip);
    break;
  case 0x1b0:
    ByteCodeReader::Float1Float32x4_1Int1_Large(&this->mReader,&this->ip);
    break;
  case 0x1b1:
    ByteCodeReader::Float32x4_2Int1Float1_Large(&this->mReader,&this->ip);
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void AsmJsEncoder::ReadOpTemplate<Js::LargeLayout>( OpCodeAsmJs op )
    {
        switch( op )
        {
#define DEF2_WMS(x, op, func) PROCESS_ENCODE_##x##_COMMON(op, func, _Large)
#define DEF3_WMS(x, op, func, y) PROCESS_ENCODE_##x##_COMMON(op, func, y, _Large)
#define DEF4_WMS(x, op, func, y, t) PROCESS_ENCODE_##x##_COMMON(op, func, y, _Large, t)
#define EXDEF2_WMS(x, op, func) PROCESS_ENCODE_##x##_COMMON(op, func, _Large)
#define EXDEF3_WMS(x, op, func, y) PROCESS_ENCODE_##x##_COMMON(op, func, y, _Large)
#define EXDEF4_WMS(x, op, func, y, t) PROCESS_ENCODE_##x##_COMMON(op, func, y, _Large, t)
#include "AsmJsEncoderHandler.inl"
        default:
            // Help the C++ optimizer by declaring that the cases we
            // have above are sufficient
#if DBG_DUMP
            Output::Print( _u("Dispatch to bad opcode : %s\n"), OpCodeUtilAsmJs::GetOpCodeName(op));
            Output::Flush();
#endif
            Assert( false );
            __assume( false );
        };
    }